

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O3

void golf_json_object_set_float_array
               (JSON_Object *obj,char *name,float *arr,int n,float min,float max)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  float fVar5;
  int v_i;
  uchar *local_78;
  int aiStack_70 [2];
  char *local_68;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  int local_44;
  JSON_Object *local_40;
  char *local_38;
  
  local_78 = (uchar *)0x0;
  aiStack_70[0] = 0;
  aiStack_70[1] = 0;
  local_68 = "json";
  if (0 < n) {
    local_50 = max - min;
    uVar3 = 0;
    local_4c = min;
    local_48 = max;
    local_40 = obj;
    local_38 = name;
    do {
      fVar5 = (arr[uVar3] - local_4c) / local_50;
      if ((fVar5 < local_4c) || (local_48 < fVar5)) {
        local_54 = fVar5;
        golf_log_warning("Number too big");
        fVar5 = local_54;
      }
      local_44 = (int)(fVar5 * 100000.0);
      iVar1 = vec_reserve_po2_((char **)&local_78,aiStack_70,aiStack_70 + 1,1,aiStack_70[0] + 4,
                               local_68);
      if (iVar1 == 0) {
        lVar2 = 0;
        do {
          lVar4 = (long)aiStack_70[0];
          aiStack_70[0] = aiStack_70[0] + 1;
          local_78[lVar4] = *(uchar *)((long)&local_44 + lVar2);
          lVar2 = lVar2 + 1;
        } while (lVar2 != 4);
      }
      uVar3 = uVar3 + 1;
      name = local_38;
      obj = local_40;
    } while (uVar3 != (uint)n);
  }
  golf_json_object_set_data(obj,name,local_78,aiStack_70[0]);
  golf_free_tracked(local_78);
  return;
}

Assistant:

void golf_json_object_set_float_array(JSON_Object *obj, const char *name, float *arr, int n, float min, float max) {
    vec_char_t data;
    vec_init(&data, "json");

    for (int i = 0; i < n; i++) {
        float v = (arr[i] - min) / (max - min);
        if (v < min || v > max) golf_log_warning("Number too big");
        int v_i = (int)(v * (float)PRECISION);
        vec_pusharr(&data, (unsigned char *)&v_i, sizeof(v_i));
    }

    golf_json_object_set_data(obj, name, (unsigned char*)data.data, data.length);

    vec_deinit(&data);
}